

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O0

void __thiscall
onmt::SentencePieceLearner::ingest_token_impl(SentencePieceLearner *this,string *token)

{
  bool bVar1;
  pointer __p;
  type pbVar2;
  ostream *poVar3;
  string *in_RSI;
  long in_RDI;
  unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                      *)0x3bd171);
  if (!bVar1) {
    __p = (pointer)(in_RDI + 0x68);
    in_stack_ffffffffffffffd0 =
         (unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          *)operator_new(0x200);
    std::ofstream::ofstream(in_stack_ffffffffffffffd0,(string *)(in_RDI + 0x40),_S_out);
    std::
    unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::reset(in_stack_ffffffffffffffd0,__p);
  }
  pbVar2 = std::
           unique_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ::operator*(in_stack_ffffffffffffffd0);
  poVar3 = std::operator<<((ostream *)pbVar2,in_RSI);
  std::operator<<(poVar3,'\n');
  return;
}

Assistant:

void SentencePieceLearner::ingest_token_impl(const std::string& token)
  {
    if (!_input_stream)
      _input_stream.reset(new std::ofstream(_input_filename));
    *_input_stream << token << '\n';
  }